

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall
libtorrent::upnp::on_upnp_get_ip_address_response
          (upnp *this,error_code *e,http_parser *p,rootdevice *d,http_connection *c)

{
  http_connection *this_00;
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  char *pcVar5;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *callback;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db_05;
  string_view input;
  span<const_char> sVar8;
  ip_address_parse_state s;
  shared_ptr<libtorrent::upnp> me;
  _Function_base local_68;
  code *local_48;
  anon_union_16_3_a3f0114d_for___in6_u local_40;
  unsigned_long local_30;
  
  ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::upnp,void>
            ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&me,
             (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
  this_00 = (d->upnp_connection).
            super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar6 = extraout_XMM0_Da;
  uVar7 = extraout_XMM0_Db;
  if (this_00 == c) {
    aux::http_connection::close(this_00,0);
    ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(d->upnp_connection).
                super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>);
    uVar6 = extraout_XMM0_Da_00;
    uVar7 = extraout_XMM0_Db_00;
  }
  if (this->m_closing != false) goto LAB_00333f8a;
  if (e->failed_ == true) {
    s._0_16_ = boost::asio::error::make_error_code(eof);
    bVar3 = boost::system::operator!=(e,(error_code *)&s);
    uVar6 = extraout_XMM0_Da_01;
    uVar7 = extraout_XMM0_Db_01;
    if (!bVar3) goto LAB_00333da4;
    iVar4 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar4 != '\0') {
      (*e->cat_->_vptr_error_category[4])(&s,e->cat_,(ulong)(uint)e->val_);
      log(this,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      ::std::__cxx11::string::~string((string *)&s);
    }
  }
  else {
LAB_00333da4:
    if (p->m_state == read_body) {
      if (p->m_status_code == 200) {
        sVar8 = aux::http_parser::get_body(p);
        pcVar5 = sVar8.m_ptr;
        iVar4 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
        if ((char)iVar4 != '\0') {
          s.super_error_code_parse_state = (error_code_parse_state)&s.ip_address;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&s,pcVar5,pcVar5 + (long)sVar8.m_len);
          log(this,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
          ::std::__cxx11::string::~string((string *)&s);
        }
        auVar2 = (undefined1  [16])s._0_16_;
        s.super_error_code_parse_state._0_4_ = s.super_error_code_parse_state._2_4_ << 0x10;
        s.super_error_code_parse_state.error_code = -1;
        s._9_7_ = auVar2._9_7_;
        s.in_ip_address = false;
        callback = (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&s.ip_address.field_2;
        s.ip_address._M_string_length = 0;
        s.ip_address.field_2._M_local_buf[0] = '\0';
        local_48 = find_ip_address;
        s.ip_address._M_dataplus._M_p = (pointer)callback;
        local_40._0_8_ = &s;
        ::std::
        function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
        ::
        function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::reference_wrapper<libtorrent::ip_address_parse_state>))(int,std::basic_string_view<char,std::char_traits<char>>,libtorrent::ip_address_parse_state&)>,void>
                  ((function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
                    *)&local_68,
                   (_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::ip_address_parse_state>))(int,_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::ip_address_parse_state_&)>
                    *)&local_48);
        input._M_str = (char *)&local_68;
        input._M_len = (size_t)pcVar5;
        aux::xml_parse((aux *)sVar8.m_len,input,callback);
        ::std::_Function_base::~_Function_base(&local_68);
        uVar6 = extraout_XMM0_Da_04;
        uVar7 = extraout_XMM0_Db_04;
        if (s.super_error_code_parse_state.error_code != -1) {
          dVar1 = log(this,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
          uVar6 = SUB84(dVar1,0);
          uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        if (s.ip_address._M_string_length == 0) {
          log(this,(double)CONCAT44(uVar7,uVar6));
        }
        else {
          log(this,(double)CONCAT44(uVar7,uVar6));
          boost::asio::ip::make_address
                    ((address *)&local_48,s.ip_address._M_dataplus._M_p,(error_code *)ignore_error);
          *(code **)&(d->external_ip).super_address = local_48;
          *(undefined8 *)&(d->external_ip).super_address.ipv6_address_.addr_.__in6_u =
               local_40._0_8_;
          *(undefined8 *)((long)&(d->external_ip).super_address.ipv6_address_.addr_.__in6_u + 8) =
               local_40._8_8_;
          (d->external_ip).super_address.ipv6_address_.scope_id_ = local_30;
        }
        if (0 < (int)(((long)(this->m_mappings).
                             super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                             .
                             super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_mappings).
                            super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                            .
                            super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x48)) {
          update_map(this,d,(port_mapping_t)0x0);
        }
        ::std::__cxx11::string::~string((string *)&s.ip_address);
        goto LAB_00333f8a;
      }
      iVar4 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar4 != '\0') {
        log(this,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      }
    }
    else {
      log(this,(double)CONCAT44(uVar7,uVar6));
    }
  }
  if (0 < (int)(((long)(this->m_mappings).
                       super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                       .
                       super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_mappings).
                      super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                      .
                      super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x48)) {
    update_map(this,d,(port_mapping_t)0x0);
  }
LAB_00333f8a:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void upnp::on_upnp_get_ip_address_response(error_code const& e
	, aux::http_parser const& p, rootdevice& d
	, http_connection& c)
{
	TORRENT_ASSERT(is_single_thread());
	std::shared_ptr<upnp> me(self());

	TORRENT_ASSERT(d.magic == 1337);
	if (d.upnp_connection && d.upnp_connection.get() == &c)
	{
		d.upnp_connection->close();
		d.upnp_connection.reset();
	}

	if (m_closing) return;

	if (e && e != boost::asio::error::eof)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while getting external IP address: %s"
				, e.message().c_str());
		}
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("error while getting external IP address: incomplete http message");
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	if (p.status_code() != 200)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while getting external IP address: %s"
				, p.message().c_str());
		}
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	// response may look like
	// <?xml version="1.0"?>
	// <s:Envelope xmlns:s="http://schemas.xmlsoap.org/soap/envelope/" s:encodingStyle="http://schemas.xmlsoap.org/soap/encoding/">
	// <s:Body><u:GetExternalIPAddressResponse xmlns:u="urn:schemas-upnp-org:service:WANIPConnection:1">
	// <NewExternalIPAddress>192.168.160.19</NewExternalIPAddress>
	// </u:GetExternalIPAddressResponse>
	// </s:Body>
	// </s:Envelope>

	span<char const> body = p.get_body();
#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("get external IP address response: %s"
			, std::string(body.data(), static_cast<std::size_t>(body.size())).c_str());
	}
#endif

	ip_address_parse_state s;
	xml_parse({body.data(), std::size_t(body.size())}, std::bind(&find_ip_address, _1, _2, std::ref(s)));
#ifndef TORRENT_DISABLE_LOGGING
	if (s.error_code != -1)
	{
		log("error while getting external IP address, code: %d", s.error_code);
	}
#endif

	if (!s.ip_address.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("got router external IP address %s", s.ip_address.c_str());
#endif
		d.external_ip = make_address(s.ip_address.c_str(), ignore_error);
	}
	else
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("failed to find external IP address in response");
#endif
	}

	if (num_mappings() > 0) update_map(d, port_mapping_t{0});
}